

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

void Acb_NtkOpt(Acb_Ntk_t *pNtk,Acb_Par_t *pPars)

{
  uint *puVar1;
  char cVar2;
  Acb_Par_t *pAVar3;
  Vec_Que_t *pVVar4;
  int *piVar5;
  int *piVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  Acb_Mfs_t *p;
  Vec_Int_t *pVVar10;
  int *piVar11;
  void *__s;
  int iVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  size_t sVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  double dVar27;
  float fVar28;
  double dVar29;
  timespec ts;
  
  p = Acb_MfsStart(pNtk,pPars);
  if (pPars->fVerbose != 0) {
    pAVar3 = p->pPars;
    pcVar16 = "Area";
    if (pAVar3->fArea == 0) {
      pcVar16 = "Delay";
    }
    printf("%s-optimization parameters: TfiLev(I) = %d  TfoLev(O) = %d  WinMax(W) = %d  LutSize = %d\n"
           ,pcVar16,(ulong)(uint)pAVar3->nTfiLevMax,(ulong)(uint)pAVar3->nTfoLevMax,
           (ulong)(uint)pAVar3->nWinNodeMax,(ulong)(uint)pAVar3->nLutSize);
  }
  iVar8 = (pNtk->vObjType).nCap;
  if ((pNtk->vFanouts).nCap < iVar8) {
    pVVar10 = (pNtk->vFanouts).pArray;
    sVar17 = (long)iVar8 << 4;
    if (pVVar10 == (Vec_Int_t *)0x0) {
      pVVar10 = (Vec_Int_t *)malloc(sVar17);
    }
    else {
      pVVar10 = (Vec_Int_t *)realloc(pVVar10,sVar17);
    }
    (pNtk->vFanouts).pArray = pVVar10;
    lVar18 = (long)(pNtk->vFanouts).nCap;
    memset(pVVar10 + lVar18,0,(iVar8 - lVar18) * 0x10);
    (pNtk->vFanouts).nCap = iVar8;
  }
  (pNtk->vFanouts).nSize = iVar8;
  if (1 < (pNtk->vObjType).nSize) {
    lVar18 = 1;
    do {
      if ((pNtk->vObjType).nSize <= lVar18) goto LAB_003a55da;
      if ((pNtk->vObjType).pArray[lVar18] != '\0') {
        if ((pNtk->vObjFans).nSize <= lVar18) {
LAB_003a55f9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar8 = (pNtk->vObjFans).pArray[lVar18];
        lVar13 = (long)iVar8;
        if ((lVar13 < 0) || ((pNtk->vFanSto).nSize <= iVar8)) {
LAB_003a559c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar11 = (pNtk->vFanSto).pArray;
        if (0 < piVar11[lVar13]) {
          lVar15 = 0;
          do {
            iVar8 = piVar11[lVar13 + lVar15 + 1];
            if (((long)iVar8 < 0) || ((pNtk->vFanouts).nSize <= iVar8)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            lVar15 = lVar15 + 1;
            Vec_IntPush((pNtk->vFanouts).pArray + iVar8,(int)lVar18);
          } while (lVar15 < piVar11[lVar13]);
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (pNtk->vObjType).nSize);
  }
  uVar23 = (pNtk->vObjType).nCap;
  if ((pNtk->vObjFunc).nCap < (int)uVar23) {
    piVar11 = (pNtk->vObjFunc).pArray;
    if (piVar11 == (int *)0x0) {
      piVar11 = (int *)malloc((long)(int)uVar23 << 2);
    }
    else {
      piVar11 = (int *)realloc(piVar11,(long)(int)uVar23 << 2);
    }
    (pNtk->vObjFunc).pArray = piVar11;
    if (piVar11 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pNtk->vObjFunc).nCap = uVar23;
  }
  if (0 < (int)uVar23) {
    memset((pNtk->vObjFunc).pArray,0xff,(ulong)uVar23 * 4);
  }
  (pNtk->vObjFunc).nSize = uVar23;
  iVar8 = (pNtk->vObjType).nCap;
  if ((pNtk->vCnfs).nCap < iVar8) {
    pVVar10 = (pNtk->vCnfs).pArray;
    sVar17 = (long)iVar8 << 4;
    if (pVVar10 == (Vec_Int_t *)0x0) {
      pVVar10 = (Vec_Int_t *)malloc(sVar17);
    }
    else {
      pVVar10 = (Vec_Int_t *)realloc(pVVar10,sVar17);
    }
    (pNtk->vCnfs).pArray = pVVar10;
    lVar18 = (long)(pNtk->vCnfs).nCap;
    memset(pVVar10 + lVar18,0,(iVar8 - lVar18) * 0x10);
    (pNtk->vCnfs).nCap = iVar8;
  }
  (pNtk->vCnfs).nSize = iVar8;
  if (p->pPars->fArea == 0) {
    Acb_NtkUpdateTiming(pNtk,-1);
    pVVar4 = pNtk->vQue;
    iVar8 = pVVar4->nSize;
    while( true ) {
      if (iVar8 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      piVar11 = &pVVar4->nSize;
      fVar25 = -1e+09;
      if (iVar8 != 1) {
        if (*pVVar4->pCostsFlt == (float *)0x0) {
          fVar25 = (float)pVVar4->pHeap[1];
        }
        else {
          fVar25 = (*pVVar4->pCostsFlt)[pVVar4->pHeap[1]];
        }
      }
      if ((int)fVar25 < 1) break;
      if (iVar8 == 1) {
        __assert_fail("p->nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xed,"int Vec_QuePop(Vec_Que_t *)");
      }
      piVar5 = pVVar4->pHeap;
      piVar6 = pVVar4->pOrder;
      iVar8 = piVar5[1];
      piVar6[iVar8] = -1;
      iVar12 = *piVar11;
      *piVar11 = iVar12 + -1;
      if (iVar12 + -1 == 1) {
        piVar5[1] = -1;
      }
      else {
        iVar9 = piVar5[(long)iVar12 + -1];
        piVar5[(long)iVar12 + -1] = -1;
        piVar5[1] = iVar9;
        piVar6[iVar9] = 1;
        pfVar7 = *pVVar4->pCostsFlt;
        if (pfVar7 == (float *)0x0) {
          fVar25 = (float)iVar9;
        }
        else {
          fVar25 = pfVar7[iVar9];
        }
        iVar12 = *piVar11;
        uVar23 = 1;
        if (2 < iVar12) {
          uVar20 = 2;
          uVar23 = 1;
          do {
            uVar14 = uVar20 | 1;
            uVar22 = uVar20;
            if ((int)uVar14 < iVar12) {
              if (pfVar7 == (float *)0x0) {
                fVar26 = (float)piVar5[(int)uVar20];
              }
              else {
                fVar26 = pfVar7[piVar5[(int)uVar20]];
              }
              if (pfVar7 == (float *)0x0) {
                fVar28 = (float)piVar5[(int)uVar14];
              }
              else {
                fVar28 = pfVar7[piVar5[(int)uVar14]];
              }
              if (fVar26 < fVar28) {
                uVar22 = uVar14;
              }
            }
            if (iVar12 <= (int)uVar22) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar12 = piVar5[(int)uVar22];
            if (pfVar7 == (float *)0x0) {
              fVar26 = (float)iVar12;
            }
            else {
              fVar26 = pfVar7[iVar12];
            }
            if (fVar26 <= fVar25) break;
            piVar5[(int)uVar23] = iVar12;
            piVar6[iVar12] = uVar23;
            uVar20 = uVar22 * 2;
            iVar12 = *piVar11;
            uVar23 = uVar22;
          } while ((int)uVar20 < iVar12);
        }
        piVar5[(int)uVar23] = iVar9;
        piVar6[iVar9] = uVar23;
      }
      if (iVar8 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
      }
      if ((pNtk->vObjType).nSize <= iVar8) {
LAB_003a55da:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((pNtk->vObjType).pArray[iVar8] != '\0') {
        Acb_NtkOptNode(p,iVar8);
      }
      pVVar4 = pNtk->vQue;
      iVar8 = pVVar4->nSize;
    }
  }
  else {
    uVar23 = (pNtk->vObjType).nSize;
    iVar8 = (((int)uVar23 >> 5) + 1) - (uint)((uVar23 & 0x1f) == 0);
    if (iVar8 == 0) {
      __s = (void *)0x0;
    }
    else {
      __s = malloc((long)iVar8 * 4);
    }
    memset(__s,0,(long)iVar8 << 2);
    Acb_NtkUpdateLevelD(pNtk,-1);
    iVar12 = 2;
    do {
      if (1 < (pNtk->vObjType).nSize) {
        uVar21 = 1;
        do {
          if ((long)(pNtk->vObjType).nSize <= (long)uVar21) goto LAB_003a55da;
          cVar2 = (pNtk->vObjType).pArray[uVar21];
          if (((cVar2 != '\0') && ((long)uVar21 < (long)(int)uVar23)) && ((byte)(cVar2 - 5U) < 0xfe)
             ) {
            if ((long)(iVar8 * 0x20) <= (long)uVar21) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            uVar20 = (uint)uVar21;
            uVar19 = uVar21 >> 5 & 0x7ffffff;
            if (((*(uint *)((long)__s + uVar19 * 4) >> (uVar20 & 0x1f) & 1) == 0) &&
               (iVar9 = Acb_NtkObjMffcEstimate(pNtk,uVar20), iVar12 <= iVar9)) {
              p->nNodes = p->nNodes + 1;
              do {
                iVar9 = Acb_NtkOptNode(p,uVar20);
                if (iVar9 == 0) break;
                if ((long)(pNtk->vObjFans).nSize <= (long)uVar21) goto LAB_003a55f9;
                iVar9 = (pNtk->vObjFans).pArray[uVar21];
                if (((long)iVar9 < 0) || ((pNtk->vFanSto).nSize <= iVar9)) goto LAB_003a559c;
              } while ((pNtk->vFanSto).pArray[iVar9] != 0);
              puVar1 = (uint *)((long)__s + uVar19 * 4);
              *puVar1 = *puVar1 | 1 << (sbyte)(uVar20 & 0x1f);
            }
          }
          uVar21 = uVar21 + 1;
        } while ((long)uVar21 < (long)(pNtk->vObjType).nSize);
      }
      bVar24 = iVar12 != 0;
      iVar12 = iVar12 + -1;
    } while (bVar24);
    if (__s != (void *)0x0) {
      free(__s);
    }
  }
  if (pPars->fVerbose != 0) {
    iVar8 = clock_gettime(3,(timespec *)&ts);
    if (iVar8 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    p->timeTotal = lVar18 - p->timeTotal;
    uVar23 = p->nWins;
    uVar20 = 1;
    if (1 < (int)uVar23) {
      uVar20 = uVar23;
    }
    iVar8 = 0x99f22c;
    printf("Node = %d  Win = %d (Ave = %d)  DivAve = %d   Change = %d  C = %d  N1 = %d  N2 = %d  N3 = %d   Over = %d  Str = %d  2Node = %d.\n"
           ,(ulong)(uint)p->nNodes,(ulong)uVar23,(long)p->nWinsAll / (long)(int)uVar20 & 0xffffffff,
           (long)p->nDivsAll / (long)(int)uVar20 & 0xffffffff,
           (ulong)(uint)(p->nChanges[2] + p->nChanges[3] + p->nChanges[1] + p->nChanges[0]),
           (ulong)(uint)p->nChanges[0],(ulong)(uint)p->nChanges[1],(ulong)(uint)p->nChanges[2],
           (ulong)(uint)p->nChanges[3],(ulong)(uint)p->nOvers,(ulong)(uint)StrCount,
           (ulong)(uint)p->nTwoNodes);
    Abc_Print(iVar8,"%s =","Windowing  ");
    dVar27 = 0.0;
    if (p->timeTotal != 0) {
      dVar27 = ((double)p->timeWin * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar8,"%9.2f sec (%6.2f %%)\n",(double)p->timeWin / 1000000.0,dVar27);
    Abc_Print(iVar8,"%s =","CNF compute");
    dVar27 = 0.0;
    if (p->timeTotal != 0) {
      dVar27 = ((double)p->timeCnf * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar8,"%9.2f sec (%6.2f %%)\n",(double)p->timeCnf / 1000000.0,dVar27);
    Abc_Print(iVar8,"%s =","Make solver");
    dVar27 = 0.0;
    if (p->timeTotal != 0) {
      dVar27 = ((double)p->timeSol * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar8,"%9.2f sec (%6.2f %%)\n",(double)p->timeSol / 1000000.0,dVar27);
    Abc_Print(iVar8,"%s =","SAT solving");
    dVar27 = 0.0;
    if (p->timeTotal != 0) {
      dVar27 = ((double)p->timeSat * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar8,"%9.2f sec (%6.2f %%)\n",(double)p->timeSat / 1000000.0,dVar27);
    Abc_Print(iVar8,"%s =","TOTAL      ");
    dVar27 = (double)p->timeTotal;
    dVar29 = 0.0;
    if (p->timeTotal != 0) {
      dVar29 = (dVar27 * 100.0) / dVar27;
    }
    Abc_Print(iVar8,"%9.2f sec (%6.2f %%)\n",dVar27 / 1000000.0,dVar29);
    fflush(_stdout);
  }
  Acb_MfsStop(p);
  StrCount = 0;
  return;
}

Assistant:

void Acb_NtkOpt( Acb_Ntk_t * pNtk, Acb_Par_t * pPars )
{
    Acb_Mfs_t * pMan = Acb_MfsStart( pNtk, pPars );
    if ( pPars->fVerbose )
        printf( "%s-optimization parameters: TfiLev(I) = %d  TfoLev(O) = %d  WinMax(W) = %d  LutSize = %d\n", 
            pMan->pPars->fArea ? "Area" : "Delay", pMan->pPars->nTfiLevMax, pMan->pPars->nTfoLevMax, pMan->pPars->nWinNodeMax, pMan->pPars->nLutSize );
    Acb_NtkCreateFanout( pNtk );  // fanout data structure
    Acb_NtkCleanObjFuncs( pNtk ); // SAT variables
    Acb_NtkCleanObjCnfs( pNtk );  // CNF representations
    if ( pMan->pPars->fArea )
    {
        int n = 0, iObj, RetValue, nNodes = Acb_NtkObjNumMax(pNtk);
        Vec_Bit_t * vVisited = Vec_BitStart( Acb_NtkObjNumMax(pNtk) );
        Acb_NtkUpdateLevelD( pNtk, -1 ); // compute forward logic level
        for ( n = 2; n >= 0; n-- )
            Acb_NtkForEachNode( pNtk, iObj )
                if ( iObj < nNodes && !Vec_BitEntry(vVisited, iObj) && Acb_NtkObjMffcEstimate(pNtk, iObj) >= n )
                {
                    pMan->nNodes++;
                    //if ( iObj != 103 )
                    //    continue;
                    //Acb_NtkOptNode( pMan, iObj );
                    while ( (RetValue = Acb_NtkOptNode(pMan, iObj)) && Acb_ObjFaninNum(pNtk, iObj) );                    
                    Vec_BitWriteEntry( vVisited, iObj, 1 );
                }
        Vec_BitFree( vVisited );
    }
    else
    {
        int Value;
        Acb_NtkUpdateTiming( pNtk, -1 ); // compute delay information
        while ( (Value = (int)Vec_QueTopPriority(pNtk->vQue)) > 0 )
        {
            int iObj = Vec_QuePop(pNtk->vQue);
            if ( !Acb_ObjType(pNtk, iObj) )
                continue;
            //if ( iObj != 103 )
            //    continue;
            //printf( "Trying node %4d (%4d) ", iObj, Value );
            Acb_NtkOptNode( pMan, iObj ); 
        }
    }
    if ( pPars->fVerbose )
    {
        pMan->timeTotal = Abc_Clock() - pMan->timeTotal;
        printf( "Node = %d  Win = %d (Ave = %d)  DivAve = %d   Change = %d  C = %d  N1 = %d  N2 = %d  N3 = %d   Over = %d  Str = %d  2Node = %d.\n", 
            pMan->nNodes, pMan->nWins, pMan->nWinsAll/Abc_MaxInt(1, pMan->nWins), pMan->nDivsAll/Abc_MaxInt(1, pMan->nWins),
            pMan->nChanges[0] + pMan->nChanges[1] + pMan->nChanges[2] + pMan->nChanges[3],
            pMan->nChanges[0], pMan->nChanges[1], pMan->nChanges[2], pMan->nChanges[3], pMan->nOvers, StrCount, pMan->nTwoNodes );
        ABC_PRTP( "Windowing  ", pMan->timeWin,    pMan->timeTotal );
        ABC_PRTP( "CNF compute", pMan->timeCnf,    pMan->timeTotal );
        ABC_PRTP( "Make solver", pMan->timeSol,    pMan->timeTotal );
        ABC_PRTP( "SAT solving", pMan->timeSat,    pMan->timeTotal );
//        ABC_PRTP( "  unsat    ", pMan->timeSatU,   pMan->timeTotal );
//        ABC_PRTP( "  sat      ", pMan->timeSatS,   pMan->timeTotal );
        ABC_PRTP( "TOTAL      ", pMan->timeTotal,  pMan->timeTotal );
        fflush( stdout );
    }
    Acb_MfsStop( pMan );
    StrCount = 0;
}